

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool rsa1_encrypted_f(Filename *filename,char **comment)

{
  LoadedFile *lf_00;
  _Bool toret;
  LoadedFile *lf;
  char **comment_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,(char **)0x0);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    filename_local._7_1_ = rsa1_encrypted_s(lf_00->binarysource_,comment);
    lf_free(lf_00);
  }
  return filename_local._7_1_;
}

Assistant:

bool rsa1_encrypted_f(const Filename *filename, char **comment)
{
    LoadedFile *lf = lf_load_keyfile(filename, NULL);
    if (!lf)
        return false; /* couldn't even open the file */

    bool toret = rsa1_encrypted_s(BinarySource_UPCAST(lf), comment);
    lf_free(lf);
    return toret;
}